

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_ManDfsNodes(Aig_Man_t *p,Aig_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_00;
  int local_2c;
  int i;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Aig_Obj_t **ppNodes_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  pAVar2 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar2);
  iVar1 = Aig_ManNodeNum(p);
  vNodes_00 = Vec_PtrAlloc(iVar1);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    iVar1 = Aig_ObjIsCo(ppNodes[local_2c]);
    if (iVar1 == 0) {
      Aig_ManDfs_rec(p,ppNodes[local_2c],vNodes_00);
    }
    else {
      pAVar2 = Aig_ObjFanin0(ppNodes[local_2c]);
      Aig_ManDfs_rec(p,pAVar2,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsNodes( Aig_Man_t * p, Aig_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
//    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark constant and PIs
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
//    Aig_ManForEachCi( p, pObj, i )
//        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    for ( i = 0; i < nNodes; i++ )
        if ( Aig_ObjIsCo(ppNodes[i]) )
            Aig_ManDfs_rec( p, Aig_ObjFanin0(ppNodes[i]), vNodes );
        else
            Aig_ManDfs_rec( p, ppNodes[i], vNodes );
    return vNodes;
}